

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_applyClosureASTFunction
          (sysbvm_context_t *context,sysbvm_tuple_t function_,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  int iVar1;
  size_t expected;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t returnTarget;
  size_t local_178;
  size_t i_1;
  size_t i;
  _Bool isNoTypecheck;
  size_t expectedArgumentCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition;
  sysbvm_functionDefinition_t **functionDefinition;
  sysbvm_function_t **closure;
  sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord;
  sysbvm_bitflags_t applicationFlags_local;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t function__local;
  sysbvm_context_t *context_local;
  
  functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] = applicationFlags;
  memset(&closure,0,0xf8);
  functionActivationRecord.previous._0_4_ = 1;
  functionActivationRecord._8_8_ = function_;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&closure);
  functionActivationRecord.function = *(sysbvm_tuple_t *)(functionActivationRecord._8_8_ + 0x48);
  sourcePositionRecord.sourcePosition =
       *(sysbvm_tuple_t *)(functionActivationRecord.function + 0x78);
  expectedArgumentCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(sourcePositionRecord.sourcePosition + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&expectedArgumentCount);
  sysbvm_functionDefinition_ensureAnalysis
            (context,(sysbvm_functionDefinition_t **)&functionActivationRecord.function);
  expected = sysbvm_array_getSize(*(sysbvm_tuple_t *)(sourcePositionRecord.sourcePosition + 0x38));
  if (argumentCount != expected) {
    sysbvm_error_argumentCountMismatch(expected,argumentCount);
  }
  sVar2 = sysbvm_functionActivationEnvironment_create(context,0,functionActivationRecord._8_8_);
  functionActivationRecord.functionDefinition = sVar2;
  returnTarget = sysbvm_tuple_uintptr_encode(context,(sysbvm_uintptr_t)&closure);
  sysbvm_analysisAndEvaluationEnvironment_setReturnTarget(context,sVar2,returnTarget);
  if ((functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] & 1) == 0) {
    for (local_178 = 0; local_178 < argumentCount; local_178 = local_178 + 1) {
      sVar2 = sysbvm_array_at(*(sysbvm_tuple_t *)(sourcePositionRecord.sourcePosition + 0x38),
                              local_178);
      sysbvm_interpreter_evaluateArgumentNodeInEnvironment
                (context,local_178,sVar2,&functionActivationRecord.functionDefinition,
                 arguments + local_178);
    }
  }
  else {
    for (i_1 = 0; i_1 < argumentCount; i_1 = i_1 + 1) {
      sysbvm_interpreter_bindArgumentNodeValueInEnvironment
                (context,i_1,&functionActivationRecord.functionDefinition,arguments[i_1]);
    }
  }
  iVar1 = _setjmp((__jmp_buf_tag *)&functionActivationRecord.result);
  if (iVar1 == 0) {
    sysbvm_gc_safepoint(context);
    functionActivationRecord.applicationEnvironment =
         sysbvm_interpreter_evaluateASTWithEnvironment
                   (context,*(sysbvm_tuple_t *)(sourcePositionRecord.sourcePosition + 0x48),
                    functionActivationRecord.functionDefinition);
  }
  sysbvm_gc_safepoint(context);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&expectedArgumentCount);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&closure);
  return functionActivationRecord.applicationEnvironment;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_applyClosureASTFunction(sysbvm_context_t *context, sysbvm_tuple_t function_, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION,
        .function = function_,
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord);  
    sysbvm_function_t **closure = (sysbvm_function_t**)&functionActivationRecord.function;

    functionActivationRecord.functionDefinition = (*closure)->definition;
    sysbvm_functionDefinition_t **functionDefinition = (sysbvm_functionDefinition_t**)&functionActivationRecord.functionDefinition;

    sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)(*functionDefinition)->sourceAnalyzedDefinition;

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, sourceAnalyzedDefinition->sourcePosition);
    sysbvm_functionDefinition_ensureAnalysis(context, functionDefinition);

    size_t expectedArgumentCount = sysbvm_array_getSize(sourceAnalyzedDefinition->argumentNodes);
    if(argumentCount != expectedArgumentCount)
        sysbvm_error_argumentCountMismatch(expectedArgumentCount, argumentCount);
    functionActivationRecord.applicationEnvironment = sysbvm_functionActivationEnvironment_create(context, SYSBVM_NULL_TUPLE, functionActivationRecord.function);
    sysbvm_analysisAndEvaluationEnvironment_setReturnTarget(context, functionActivationRecord.applicationEnvironment, sysbvm_tuple_uintptr_encode(context, (uintptr_t)&functionActivationRecord));

    bool isNoTypecheck = (applicationFlags & SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK) != 0;
    if(isNoTypecheck)
    {
        // Avoid the coercion here.
        for(size_t i = 0; i < argumentCount; ++i)
            sysbvm_interpreter_bindArgumentNodeValueInEnvironment(context, i, &functionActivationRecord.applicationEnvironment, arguments[i]);
    }
    else
    {
        // FIXME: Add support for the forall arguments here.
        for(size_t i = 0; i < argumentCount; ++i)
            sysbvm_interpreter_evaluateArgumentNodeInEnvironment(context, i, sysbvm_array_at(sourceAnalyzedDefinition->argumentNodes, i), &functionActivationRecord.applicationEnvironment, &arguments[i]);
    }

    // Use setjmp for implementing the #return: statement.
    if(!_setjmp(functionActivationRecord.jmpbuffer))
    {
        sysbvm_gc_safepoint(context);
        functionActivationRecord.result = sysbvm_interpreter_evaluateASTWithEnvironment(context, sourceAnalyzedDefinition->bodyNode, functionActivationRecord.applicationEnvironment);
    }

    sysbvm_gc_safepoint(context);
    
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord);  
    return functionActivationRecord.result;
}